

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall
doctest::detail::ResultBuilder::
binary_assert<0,std::vector<MockStruct,std::allocator<MockStruct>>,std::vector<MockStruct,std::allocator<MockStruct>>>
          (ResultBuilder *this,vector<MockStruct,_std::allocator<MockStruct>_> *lhs,
          vector<MockStruct,_std::allocator<MockStruct>_> *rhs)

{
  bool bVar1;
  ContextOptions *pCVar2;
  vector<MockStruct,_std::allocator<MockStruct>_> *in_R8;
  String SStack_38;
  
  bVar1 = eq<std::vector<MockStruct,std::allocator<MockStruct>>,std::vector<MockStruct,std::allocator<MockStruct>>>
                    (lhs,rhs);
  (this->super_AssertData).m_failed = !bVar1;
  if ((bVar1) && (pCVar2 = getContextOptions(), pCVar2->success != true)) {
    return;
  }
  stringifyBinaryExpr<std::vector<MockStruct,std::allocator<MockStruct>>,std::vector<MockStruct,std::allocator<MockStruct>>>
            (&SStack_38,(detail *)lhs,(vector<MockStruct,_std::allocator<MockStruct>_> *)0x1bc83a,
             (char *)rhs,in_R8);
  String::operator=(&(this->super_AssertData).m_decomp,&SStack_38);
  String::~String(&SStack_38);
  return;
}

Assistant:

DOCTEST_NOINLINE void binary_assert(const DOCTEST_REF_WRAP(L) lhs,
                                            const DOCTEST_REF_WRAP(R) rhs) {
            m_failed = !RelationalComparator<comparison, L, R>()(lhs, rhs);
            if(m_failed || getContextOptions()->success)
                m_decomp = stringifyBinaryExpr(lhs, ", ", rhs);
        }